

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void dump_regressor(vw *all,string *reg_name,bool as_text)

{
  size_t __n;
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  vw_exception *this;
  long *plVar4;
  bool bVar5;
  string start_name;
  stringstream __msg;
  io_buf io_temp;
  long *local_298;
  long local_288;
  long lStack_280;
  string local_278;
  ostream *local_258;
  size_t local_250;
  ostream local_248;
  io_buf local_d0;
  
  local_258 = &local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  __n = reg_name->_M_string_length;
  if (__n == local_250) {
    if (__n == 0) {
      bVar5 = true;
    }
    else {
      iVar1 = bcmp((reg_name->_M_dataplus)._M_p,local_258,__n);
      bVar5 = iVar1 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (!bVar5) {
    local_258 = &local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,".writing","");
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_258,0,(char *)0x0,(ulong)(reg_name->_M_dataplus)._M_p)
    ;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_288 = *plVar4;
      lStack_280 = plVar2[3];
      local_298 = &local_288;
    }
    else {
      local_288 = *plVar4;
      local_298 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    local_d0._vptr_io_buf = (_func_int **)&PTR_open_file_002d64d0;
    local_d0.space._begin = (char *)0x0;
    local_d0.space._end = (char *)0x0;
    local_d0.space.end_array = (char *)0x0;
    local_d0.space.erase_count = 0;
    local_d0.files._begin = (int *)0x0;
    local_d0.files._end = (int *)0x0;
    local_d0.files.end_array = (int *)0x0;
    local_d0.files.erase_count = 0;
    local_d0.currentname._begin = (char *)0x0;
    local_d0.currentname._end = (char *)0x0;
    local_d0.currentname.end_array = (char *)0x0;
    local_d0.currentname.erase_count = 0;
    local_d0.finalname._begin = (char *)0x0;
    local_d0.finalname._end = (char *)0x0;
    local_d0.finalname.end_array = (char *)0x0;
    local_d0.finalname.erase_count = 0;
    v_array<char>::resize(&local_d0.space,0x10000);
    local_d0.count = 0;
    local_d0.current = 0;
    local_d0.head = local_d0.space._begin;
    local_d0._verify_hash = false;
    local_d0._hash = 0;
    io_buf::open_file(&local_d0,(char *)local_298,all->stdin_off,2);
    dump_regressor(all,&local_d0,as_text);
    remove((reg_name->_M_dataplus)._M_p);
    iVar1 = rename((char *)local_298,(reg_name->_M_dataplus)._M_p);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_258);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_248,
                 "WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: ",
                 0x4d);
      poVar3 = std::operator<<(&local_248,(char *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," to ",4);
      std::operator<<(poVar3,(reg_name->_M_dataplus)._M_p);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x237,&local_278);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    io_buf::~io_buf(&local_d0);
    if (local_298 != &local_288) {
      operator_delete(local_298);
    }
  }
  return;
}

Assistant:

void dump_regressor(vw& all, string reg_name, bool as_text)
{
  if (reg_name == string(""))
    return;
  string start_name = reg_name + string(".writing");
  io_buf io_temp;

  io_temp.open_file(start_name.c_str(), all.stdin_off, io_buf::WRITE);

  dump_regressor(all, io_temp, as_text);

  remove(reg_name.c_str());

  if (0 != rename(start_name.c_str(), reg_name.c_str()))
    THROW("WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: "
        << start_name.c_str() << " to " << reg_name.c_str());
}